

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowControl.hpp
# Opt level: O1

void InstructionSet::x86::Primitive::
     ret_far<InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
               (Instruction<false> instruction,Context *context)

{
  uint16_t *puVar1;
  undefined2 uVar2;
  Registers *pRVar3;
  Segments *pSVar4;
  type_conflict2 tVar5;
  type_conflict2 tVar6;
  short local_2c [2];
  
  tVar5 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (&context->memory,SS,(context->registers).sp_);
  uVar2 = (context->registers).sp_;
  (context->registers).sp_ = uVar2 + 2;
  tVar6 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (&context->memory,SS,uVar2 + 2);
  puVar1 = &(context->registers).sp_;
  *puVar1 = *puVar1 + 2;
  local_2c[0] = 0;
  local_2c[1] = instruction.extensions_[0];
  puVar1 = &(context->registers).sp_;
  *puVar1 = *puVar1 + *(short *)((long)local_2c + (ulong)((uint)((ulong)instruction >> 0xc) & 2));
  pRVar3 = (context->flow_controller).registers_;
  pRVar3->cs_ = tVar6;
  pSVar4 = (context->flow_controller).segments_;
  pSVar4->cs_base_ = (uint)pSVar4->registers_->cs_ << 4;
  pRVar3->ip_ = tVar5;
  return;
}

Assistant:

void ret_far(
	InstructionT instruction,
	ContextT &context
) {
	context.memory.preauthorise_stack_read(sizeof(uint16_t) * 2);
	const auto ip = pop<uint16_t, true>(context);
	const auto cs = pop<uint16_t, true>(context);
	context.registers.sp() += instruction.operand();
	context.flow_controller.template jump<uint16_t>(cs, ip);
}